

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_action.hpp
# Opt level: O1

bool __thiscall
cpp_properties::
properties_action<cpp_properties::properties_actor<cpp_properties::properties_actor_traits<std::deque<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,std::__cxx11::string,cpp_properties::emplace_back_adapter_policy>>>
::operator()(properties_action<cpp_properties::properties_actor<cpp_properties::properties_actor_traits<std::deque<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>,std::__cxx11::string,cpp_properties::emplace_back_adapter_policy>>>
             *this,token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::mpl::vector0<mpl_::na>,_mpl_::bool_<true>,_unsigned_long>
                   *token)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  code *pcVar4;
  
  switch((token->
         super_token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<true>,_unsigned_long>
         ).
         super_token<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>,_mpl_::bool_<false>,_unsigned_long>
         .id_) {
  case 0x3f6:
    latin1_to_utf8<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
              (&local_30,(cpp_properties *)&token->value_,in_RDX);
    lVar3 = *(long *)this;
    pcVar4 = *(code **)(lVar3 + 0x50);
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *(long *)(lVar3 + *(long *)(lVar3 + 0x58)) + -1);
    }
    pcVar2 = (char *)(*pcVar4)();
    std::__cxx11::string::_M_append(pcVar2,(ulong)local_30._M_dataplus._M_p);
    break;
  case 0x3f7:
    cVar1 = escape_sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                      (&token->value_);
    encode_latin1_to_utf8<char>(&local_30,cVar1);
    lVar3 = *(long *)this;
    pcVar4 = *(code **)(lVar3 + 0x50);
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *(long *)(lVar3 + *(long *)(lVar3 + 0x58)) + -1);
    }
    pcVar2 = (char *)(*pcVar4)();
    std::__cxx11::string::_M_append(pcVar2,(ulong)local_30._M_dataplus._M_p);
    break;
  case 0x3f8:
    decode_to_utf8<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
              (&local_30,(cpp_properties *)&token->value_,in_RDX);
    lVar3 = *(long *)this;
    pcVar4 = *(code **)(lVar3 + 0x50);
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *(long *)(lVar3 + *(long *)(lVar3 + 0x58)) + -1);
    }
    pcVar2 = (char *)(*pcVar4)();
    std::__cxx11::string::_M_append(pcVar2,(ulong)local_30._M_dataplus._M_p);
    break;
  default:
    goto switchD_0011dbb0_caseD_3f9;
  case 0x3fa:
  case 0x3fb:
  case 0x3fc:
  case 0x403:
  case 0x404:
  case 0x405:
  case 0x40e:
  case 0x40f:
  case 0x410:
    properties_actor<cpp_properties::properties_actor_traits<std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_back_adapter_policy>_>
    ::push_back(*(properties_actor<cpp_properties::properties_actor_traits<std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_properties::emplace_back_adapter_policy>_>
                  **)this);
    return true;
  case 0x400:
  case 0x401:
    lVar3 = *(long *)this;
    pcVar4 = *(code **)(lVar3 + 0x50);
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *(long *)(lVar3 + *(long *)(lVar3 + 0x58)) + -1);
    }
    (*pcVar4)();
    return true;
  case 0x409:
  case 0x40a:
    latin1_to_utf8<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
              (&local_30,(cpp_properties *)&token->value_,in_RDX);
    lVar3 = *(long *)this;
    pcVar4 = *(code **)(lVar3 + 0x50);
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *(long *)(lVar3 + *(long *)(lVar3 + 0x58)) + -1);
    }
    lVar3 = (*pcVar4)();
    std::__cxx11::string::_M_append((char *)(lVar3 + 0x20),(ulong)local_30._M_dataplus._M_p);
    break;
  case 0x40b:
    cVar1 = escape_sequence<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                      (&token->value_);
    encode_latin1_to_utf8<char>(&local_30,cVar1);
    lVar3 = *(long *)this;
    pcVar4 = *(code **)(lVar3 + 0x50);
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *(long *)(lVar3 + *(long *)(lVar3 + 0x58)) + -1);
    }
    lVar3 = (*pcVar4)();
    std::__cxx11::string::_M_append((char *)(lVar3 + 0x20),(ulong)local_30._M_dataplus._M_p);
    break;
  case 0x40c:
    decode_to_utf8<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
              (&local_30,(cpp_properties *)&token->value_,in_RDX);
    lVar3 = *(long *)this;
    pcVar4 = *(code **)(lVar3 + 0x50);
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *(long *)(lVar3 + *(long *)(lVar3 + 0x58)) + -1);
    }
    lVar3 = (*pcVar4)();
    std::__cxx11::string::_M_append((char *)(lVar3 + 0x20),(ulong)local_30._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
switchD_0011dbb0_caseD_3f9:
  return true;
}

Assistant:

bool operator()(Token const &token) const {
    using namespace token;
    switch (token.id()) {
    case ID_KEY_CHARS:
      actor.current().first += latin1_to_utf8(token.value());
      break;
    case ID_KEY_ESCAPE_CHAR:
      actor.current().first += escape_sequence_to_utf8(token.value());
      break;
    case ID_KEY_UNICODE:
      actor.current().first += decode_to_utf8(token.value());
      break;
    case ID_KEY_CR:
    case ID_KEY_LF:
    case ID_KEY_EOL:
    case ID_SEPARATOR_CR:
    case ID_SEPARATOR_LF:
    case ID_SEPARATOR_EOL:
      actor.push_back();
      break;
    case ID_SEPARATOR_EQUAL:
    case ID_SEPARATOR_COLON:
      // force initialization for useless empty key/value case
      actor.current();
      break;
    case ID_VALUE_SPACES:
    case ID_VALUE_CHARS:
      actor.current().second += latin1_to_utf8(token.value());
      break;
    case ID_VALUE_ESCAPE_CHAR:
      actor.current().second += escape_sequence_to_utf8(token.value());
      break;
    case ID_VALUE_UNICODE:
      actor.current().second += decode_to_utf8(token.value());
      break;
    case ID_VALUE_CR:
    case ID_VALUE_LF:
    case ID_VALUE_EOL:
      actor.push_back();
      break;
    }

    // always continue to tokenize
    return true;
  }